

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O0

void test_23(QPDF *pdf,char *arg2)

{
  reference pvVar1;
  QPDFPageObjectHelper local_98;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> local_50 [8];
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> pages;
  undefined1 local_38 [8];
  QPDFPageDocumentHelper dh;
  char *arg2_local;
  QPDF *pdf_local;
  
  dh.m.super___shared_ptr<QPDFPageDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)arg2;
  QPDFPageDocumentHelper::QPDFPageDocumentHelper((QPDFPageDocumentHelper *)local_38,pdf);
  QPDFPageDocumentHelper::getAllPages();
  pvVar1 = std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::back(local_50);
  QPDFPageObjectHelper::QPDFPageObjectHelper(&local_98,pvVar1);
  QPDFPageDocumentHelper::removePage((QPDFPageObjectHelper *)local_38);
  QPDFPageObjectHelper::~QPDFPageObjectHelper(&local_98);
  std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector(local_50);
  QPDFPageDocumentHelper::~QPDFPageDocumentHelper((QPDFPageDocumentHelper *)local_38);
  return;
}

Assistant:

static void
test_23(QPDF& pdf, char const* arg2)
{
    QPDFPageDocumentHelper dh(pdf);
    std::vector<QPDFPageObjectHelper> pages = dh.getAllPages();
    dh.removePage(pages.back());
}